

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O1

reentrant_put_transaction<void> *
density_tests::detail::
PutUInt16<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *param_2)

{
  ElementType_conflict val;
  reentrant_put_transaction<unsigned_short> transaction;
  unsigned_short local_8a;
  reentrant_put_transaction<unsigned_short> local_88;
  reentrant_put_transaction<unsigned_short> local_68;
  reentrant_put_transaction<unsigned_short> local_40;
  
  local_8a = 0x10;
  density::
  sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::start_reentrant_emplace<unsigned_short,unsigned_short&>
            (&local_40,
             (sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)i_queue,&local_8a);
  local_68.m_put.m_control_block = local_40.m_put.m_control_block;
  local_68.m_put.m_next_ptr = local_40.m_put.m_next_ptr;
  local_68.m_put.m_user_storage = local_40.m_put.m_user_storage;
  local_68.m_queue = local_40.m_queue;
  local_40.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<unsigned_short>::~reentrant_put_transaction(&local_40);
  local_88.m_put.m_control_block = local_68.m_put.m_control_block;
  local_88.m_put.m_next_ptr = local_68.m_put.m_next_ptr;
  local_88.m_put.m_user_storage = local_68.m_put.m_user_storage;
  local_88.m_queue = local_68.m_queue;
  local_68.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<unsigned_short>::~reentrant_put_transaction(&local_68);
  exception_checkpoint();
  (__return_storage_ptr__->m_put).m_user_storage = local_88.m_put.m_user_storage;
  (__return_storage_ptr__->m_put).m_control_block = local_88.m_put.m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = local_88.m_put.m_next_ptr;
  __return_storage_ptr__->m_queue = local_88.m_queue;
  local_88.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<unsigned_short>::~reentrant_put_transaction(&local_88);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                ElementType val         = 16;
                auto        transaction = i_queue.start_reentrant_push(val);
                exception_checkpoint();
                return std::move(transaction);
            }